

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookptravltree.h
# Opt level: O0

Node * cookmem::PtrAVLTree::rotateWithRightChild(Node *root)

{
  Node *root_00;
  Node *right;
  Node *root_local;
  
  root_00 = root->right;
  setRightChild(root,root_00->left);
  setLeftChild(root_00,root);
  updateHeight(root);
  updateHeight(root_00);
  return root_00;
}

Assistant:

inline static Node*
    rotateWithRightChild (Node* root)
    {
        Node* right = root->right;
        setRightChild (root, right->left);
        setLeftChild (right, root);
        updateHeight (root);
        updateHeight (right);
        return right;
    }